

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation.cpp
# Opt level: O1

ChVector<double> * __thiscall
chrono::ChFunctionRotation::Get_w_loc
          (ChVector<double> *__return_storage_ptr__,ChFunctionRotation *this,double s)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  ChQuaternion<double> q1;
  ChQuaternion<double> q0;
  undefined1 local_60 [16];
  double dStack_50;
  double dStack_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  
  (*this->_vptr_ChFunctionRotation[3])(&local_40);
  (*this->_vptr_ChFunctionRotation[3])(s + 1e-07,local_60,this);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_40;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_60._0_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_60._8_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_38 * (double)local_60._8_8_;
  auVar6 = vfmadd231sd_fma(auVar26,auVar6,auVar15);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_30;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dStack_50;
  auVar6 = vfmadd231sd_fma(auVar6,auVar10,auVar20);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_28;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dStack_48;
  auVar6 = vfmadd231sd_fma(auVar6,auVar13,auVar23);
  if (auVar6._0_8_ < 0.0) {
    auVar6 = vunpcklpd_avx(auVar20,auVar23);
    auVar10 = vunpcklpd_avx(auVar15,auVar19);
    auVar18._16_16_ = auVar6;
    auVar18._0_16_ = auVar10;
    auVar5._8_8_ = 0x8000000000000000;
    auVar5._0_8_ = 0x8000000000000000;
    auVar5._16_8_ = 0x8000000000000000;
    auVar5._24_8_ = 0x8000000000000000;
    _local_60 = vxorpd_avx512vl(auVar18,auVar5);
  }
  dVar1 = ((double)local_60._0_8_ - local_40) * 10000000.0;
  dVar2 = ((double)local_60._8_8_ - local_38) * 10000000.0;
  dVar3 = (dStack_50 - local_30) * 10000000.0;
  dVar4 = (dStack_48 - local_28) * 10000000.0;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_38 + local_38;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar1;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = (local_40 + local_40) * dVar2;
  auVar6 = vfnmadd231sd_fma(auVar27,auVar8,auVar16);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_28 + local_28;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar3;
  auVar6 = vfmadd231sd_fma(auVar6,auVar14,auVar21);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_30 + local_30;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar4;
  auVar13 = vfnmadd231sd_fma(auVar6,auVar11,auVar24);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar2 * (local_28 + local_28);
  auVar6 = vfnmsub231sd_fma(auVar28,auVar11,auVar16);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_40 + local_40;
  auVar6 = vfmadd231sd_fma(auVar6,auVar7,auVar21);
  auVar6 = vfmadd231sd_fma(auVar6,auVar8,auVar24);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = (local_30 + local_30) * dVar2;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar1;
  auVar10 = vfnmadd231sd_fma(auVar12,auVar14,auVar17);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_38 + local_38;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar3;
  auVar10 = vfnmadd231sd_fma(auVar10,auVar9,auVar22);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar4;
  auVar10 = vfmadd231sd_fma(auVar10,auVar7,auVar25);
  __return_storage_ptr__->m_data[0] = auVar13._0_8_;
  __return_storage_ptr__->m_data[1] = auVar6._0_8_;
  __return_storage_ptr__->m_data[2] = auVar10._0_8_;
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChFunctionRotation::Get_w_loc(double s) const { 
		ChQuaternion<> q0 = Get_q(s);
		ChQuaternion<> q1 = Get_q(s + BDF_STEP_LOW);
		if (q0.Dot(q1) < 0)
			q1 = -q1; // because q1 and -q1 are the same rotation, but for finite difference we must use the closest to q0
		ChQuaternion<> qdt = (q1 - q0) / BDF_STEP_LOW;
		ChGlMatrix34<> Gl(q0);
        return Gl * qdt;
}